

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camellia.c
# Opt level: O0

int mbedtls_camellia_crypt_ecb(mbedtls_camellia_context *ctx,int mode,uchar *input,uchar *output)

{
  uint uVar1;
  uint uVar2;
  uint32_t *puVar3;
  uint local_48;
  uint local_44;
  uint32_t X [4];
  uint32_t *RK;
  int NR;
  uchar *output_local;
  uchar *input_local;
  int mode_local;
  mbedtls_camellia_context *ctx_local;
  
  RK._4_4_ = ctx->nr;
  local_48 = ctx->rk[0] ^
             ((uint)*input << 0x18 | (uint)input[1] << 0x10 | (uint)input[2] << 8 | (uint)input[3]);
  local_44 = ctx->rk[1] ^
             ((uint)input[4] << 0x18 | (uint)input[5] << 0x10 | (uint)input[6] << 8 | (uint)input[7]
             );
  X[0] = ctx->rk[2] ^
         ((uint)input[8] << 0x18 | (uint)input[9] << 0x10 | (uint)input[10] << 8 | (uint)input[0xb])
  ;
  X[1] = ctx->rk[3] ^
         ((uint)input[0xc] << 0x18 | (uint)input[0xd] << 0x10 | (uint)input[0xe] << 8 |
         (uint)input[0xf]);
  puVar3 = ctx->rk + 4;
  while (X._8_8_ = puVar3, RK._4_4_ != 0) {
    RK._4_4_ = RK._4_4_ + -1;
    camellia_feistel(&local_48,(uint32_t *)X._8_8_,X);
    X._8_8_ = X._8_8_ + 8;
    camellia_feistel(X,(uint32_t *)X._8_8_,&local_48);
    X._8_8_ = X._8_8_ + 8;
    camellia_feistel(&local_48,(uint32_t *)X._8_8_,X);
    X._8_8_ = X._8_8_ + 8;
    camellia_feistel(X,(uint32_t *)X._8_8_,&local_48);
    X._8_8_ = X._8_8_ + 8;
    camellia_feistel(&local_48,(uint32_t *)X._8_8_,X);
    X._8_8_ = X._8_8_ + 8;
    camellia_feistel(X,(uint32_t *)X._8_8_,&local_48);
    puVar3 = (uint32_t *)(X._8_8_ + 8);
    if (RK._4_4_ != 0) {
      local_44 = ((local_48 & *puVar3) << 1 | (local_48 & *puVar3) >> 0x1f) ^ local_44;
      local_48 = (local_44 | *(uint *)(X._8_8_ + 0xc)) ^ local_48;
      X[0] = (X[1] | *(uint *)(X._8_8_ + 0x14)) ^ X[0];
      X[1] = ((X[0] & *(uint *)(X._8_8_ + 0x10)) << 1 | (X[0] & *(uint *)(X._8_8_ + 0x10)) >> 0x1f)
             ^ X[1];
      puVar3 = (uint32_t *)(X._8_8_ + 0x18);
    }
  }
  uVar1 = *(uint *)X._8_8_ ^ X[0];
  uVar2 = *(uint *)(X._8_8_ + 4) ^ X[1];
  local_48 = *(uint *)(X._8_8_ + 8) ^ local_48;
  local_44 = *(uint *)(X._8_8_ + 0xc) ^ local_44;
  *output = (uchar)(uVar1 >> 0x18);
  output[1] = (uchar)(uVar1 >> 0x10);
  output[2] = (uchar)(uVar1 >> 8);
  output[3] = (uchar)uVar1;
  output[4] = (uchar)(uVar2 >> 0x18);
  output[5] = (uchar)(uVar2 >> 0x10);
  output[6] = (uchar)(uVar2 >> 8);
  output[7] = (uchar)uVar2;
  output[8] = (uchar)(local_48 >> 0x18);
  output[9] = (uchar)(local_48 >> 0x10);
  output[10] = (uchar)(local_48 >> 8);
  output[0xb] = (uchar)local_48;
  output[0xc] = (uchar)(local_44 >> 0x18);
  output[0xd] = (uchar)(local_44 >> 0x10);
  output[0xe] = (uchar)(local_44 >> 8);
  output[0xf] = (uchar)local_44;
  return 0;
}

Assistant:

int mbedtls_camellia_crypt_ecb( mbedtls_camellia_context *ctx,
                    int mode,
                    const unsigned char input[16],
                    unsigned char output[16] )
{
    int NR;
    uint32_t *RK, X[4];
    CAMELLIA_VALIDATE_RET( ctx != NULL );
    CAMELLIA_VALIDATE_RET( mode == MBEDTLS_CAMELLIA_ENCRYPT ||
                           mode == MBEDTLS_CAMELLIA_DECRYPT );
    CAMELLIA_VALIDATE_RET( input  != NULL );
    CAMELLIA_VALIDATE_RET( output != NULL );

    ( (void) mode );

    NR = ctx->nr;
    RK = ctx->rk;

    GET_UINT32_BE( X[0], input,  0 );
    GET_UINT32_BE( X[1], input,  4 );
    GET_UINT32_BE( X[2], input,  8 );
    GET_UINT32_BE( X[3], input, 12 );

    X[0] ^= *RK++;
    X[1] ^= *RK++;
    X[2] ^= *RK++;
    X[3] ^= *RK++;

    while( NR ) {
        --NR;
        camellia_feistel( X, RK, X + 2 );
        RK += 2;
        camellia_feistel( X + 2, RK, X );
        RK += 2;
        camellia_feistel( X, RK, X + 2 );
        RK += 2;
        camellia_feistel( X + 2, RK, X );
        RK += 2;
        camellia_feistel( X, RK, X + 2 );
        RK += 2;
        camellia_feistel( X + 2, RK, X );
        RK += 2;

        if( NR ) {
            FL(X[0], X[1], RK[0], RK[1]);
            RK += 2;
            FLInv(X[2], X[3], RK[0], RK[1]);
            RK += 2;
        }
    }

    X[2] ^= *RK++;
    X[3] ^= *RK++;
    X[0] ^= *RK++;
    X[1] ^= *RK++;

    PUT_UINT32_BE( X[2], output,  0 );
    PUT_UINT32_BE( X[3], output,  4 );
    PUT_UINT32_BE( X[0], output,  8 );
    PUT_UINT32_BE( X[1], output, 12 );

    return( 0 );
}